

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<float>::~RepeatedField(RepeatedField<float> *this)

{
  Arena *this_00;
  float *pfVar1;
  
  this_00 = GetArena(this);
  if (this_00 != (Arena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)this_00);
  }
  if (0 < this->total_size_) {
    pfVar1 = elements(this);
    InternalDeallocate(this,(Rep *)(pfVar1 + -2),this->total_size_);
    return;
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds. If arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena();
  if (arena) (void)arena->SpaceAllocated();
#endif
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}